

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.c
# Opt level: O3

sds sdscatfmt(sds s,char *fmt,...)

{
  char *pcVar1;
  byte bVar2;
  char *__s;
  char in_AL;
  int iVar3;
  size_t sVar4;
  sds s_00;
  ulong uVar5;
  byte *pbVar6;
  void **ppvVar7;
  uint uVar8;
  undefined8 in_RCX;
  ulong uVar9;
  undefined8 in_RDX;
  char cVar10;
  byte *pbVar11;
  void *pvVar12;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buf [21];
  void **local_120;
  byte local_109;
  byte local_108 [32];
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  switch(s[-1] & 7) {
  case 0:
    uVar15 = (ulong)((byte)s[-1] >> 3);
    break;
  case 1:
    uVar15 = (ulong)(byte)s[-3];
    break;
  case 2:
    uVar15 = (ulong)*(ushort *)(s + -5);
    break;
  case 3:
    uVar15 = (ulong)*(uint *)(s + -9);
    break;
  case 4:
    uVar15 = *(ulong *)(s + -0x11);
    break;
  default:
    uVar15 = 0;
  }
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  sVar4 = strlen(fmt);
  s_00 = sdsMakeRoomFor(s,sVar4 * 2 + uVar15);
  uVar8 = 0x10;
  local_120 = &ap[0].overflow_arg_area;
  cVar10 = *fmt;
  do {
    if (cVar10 == '\0') {
      s_00[uVar15] = '\0';
      return s_00;
    }
    switch(s_00[-1] & 7) {
    case 1:
      uVar5 = (ulong)(byte)s_00[-2];
      uVar17 = (ulong)(byte)s_00[-3];
      goto LAB_00107f76;
    case 2:
      uVar5 = (ulong)*(ushort *)(s_00 + -3);
      uVar17 = (ulong)*(ushort *)(s_00 + -5);
LAB_00107f76:
      uVar5 = uVar5 - uVar17;
      break;
    case 3:
      uVar5 = (ulong)(uint)(*(int *)(s_00 + -5) - *(int *)(s_00 + -9));
      break;
    case 4:
      uVar5 = *(long *)(s_00 + -9) - *(long *)(s_00 + -0x11);
      break;
    default:
      goto switchD_00107f50_default;
    }
    if (uVar5 == 0) {
switchD_00107f50_default:
      s_00 = sdsMakeRoomFor(s_00,1);
      cVar10 = *fmt;
    }
    if (cVar10 != '%') {
      s_00[uVar15] = cVar10;
      uVar15 = uVar15 + 1;
      switch(s_00[-1] & 7) {
      case 0:
        s_00[-1] = (s_00[-1] & 0xf8U) + 8;
        break;
      case 1:
        s_00[-3] = s_00[-3] + '\x01';
        break;
      case 2:
        *(short *)(s_00 + -5) = *(short *)(s_00 + -5) + 1;
        break;
      case 3:
        *(int *)(s_00 + -9) = *(int *)(s_00 + -9) + 1;
        break;
      case 4:
        *(long *)(s_00 + -0x11) = *(long *)(s_00 + -0x11) + 1;
      }
      goto switchD_0010805b_default;
    }
    pcVar1 = fmt + 1;
    bVar2 = fmt[1];
    if (0x54 < bVar2) {
      if (0x72 < bVar2) {
        if (bVar2 == 0x75) {
          uVar5 = (ulong)uVar8;
          if (uVar5 < 0x29) {
            uVar8 = uVar8 + 8;
            ppvVar7 = (void **)((long)local_e8 + uVar5);
          }
          else {
            ppvVar7 = local_120;
            local_120 = local_120 + 1;
          }
          pvVar12 = (void *)(ulong)*(uint *)ppvVar7;
          goto LAB_001081a5;
        }
        if (bVar2 == 0x73) goto LAB_00108073;
LAB_00108034:
        s_00[uVar15] = bVar2;
        uVar15 = uVar15 + 1;
        fmt = pcVar1;
        switch(s_00[-1] & 7) {
        case 0:
          s_00[-1] = (s_00[-1] & 0xf8U) + 8;
          break;
        case 1:
          s_00[-3] = s_00[-3] + '\x01';
          break;
        case 2:
          *(short *)(s_00 + -5) = *(short *)(s_00 + -5) + 1;
          break;
        case 3:
          *(int *)(s_00 + -9) = *(int *)(s_00 + -9) + 1;
          break;
        case 4:
          *(long *)(s_00 + -0x11) = *(long *)(s_00 + -0x11) + 1;
        }
        goto switchD_0010805b_default;
      }
      if (bVar2 != 0x55) {
        if (bVar2 == 0x69) {
          uVar5 = (ulong)uVar8;
          if (uVar5 < 0x29) {
            uVar8 = uVar8 + 8;
            ppvVar7 = (void **)((long)local_e8 + uVar5);
          }
          else {
            ppvVar7 = local_120;
            local_120 = local_120 + 1;
          }
          pvVar12 = (void *)(long)(int)*(uint *)ppvVar7;
          goto LAB_00108272;
        }
        goto LAB_00108034;
      }
      uVar5 = (ulong)uVar8;
      if (uVar5 < 0x29) {
        uVar8 = uVar8 + 8;
        ppvVar7 = (void **)((long)local_e8 + uVar5);
      }
      else {
        ppvVar7 = local_120;
        local_120 = local_120 + 1;
      }
      pvVar12 = *ppvVar7;
LAB_001081a5:
      lVar16 = 0;
      cVar10 = '\0';
      pbVar6 = &local_109;
      lVar14 = 0;
      do {
        lVar13 = lVar14;
        pbVar11 = pbVar6;
        lVar16 = lVar16 + 0x100000000;
        local_108[lVar13] = (char)pvVar12 + (char)(void *)((ulong)pvVar12 / 10) * -10 | 0x30;
        lVar14 = lVar13 + 1;
        cVar10 = cVar10 + '\b';
        bVar18 = (void *)0x9 < pvVar12;
        pbVar6 = pbVar11 + 1;
        pvVar12 = (void *)((ulong)pvVar12 / 10);
      } while (bVar18);
      local_108[lVar13 + 1] = 0;
      if (local_108 < local_108 + lVar13) {
        pbVar6 = local_108;
        do {
          bVar2 = *pbVar6;
          *pbVar6 = pbVar11[1];
          pbVar11[1] = bVar2;
          pbVar6 = pbVar6 + 1;
          bVar18 = pbVar6 < pbVar11;
          pbVar11 = pbVar11 + -1;
        } while (bVar18);
      }
      switch(s_00[-1] & 7) {
      case 1:
        uVar5 = (ulong)(byte)s_00[-2];
        uVar17 = (ulong)(byte)s_00[-3];
        goto switchD_001073e4_caseD_74;
      case 2:
        uVar5 = (ulong)*(ushort *)(s_00 + -3);
        uVar17 = (ulong)*(ushort *)(s_00 + -5);
switchD_001073e4_caseD_74:
        uVar5 = uVar5 - uVar17;
        break;
      case 3:
        uVar5 = (ulong)(uint)(*(int *)(s_00 + -5) - *(int *)(s_00 + -9));
        break;
      case 4:
        uVar5 = *(long *)(s_00 + -9) - *(long *)(s_00 + -0x11);
        break;
      default:
        uVar5 = 0;
      }
      uVar17 = lVar16 >> 0x20;
      if (uVar5 < uVar17) {
        s_00 = sdsMakeRoomFor(s_00,uVar17);
      }
      memcpy(s_00 + uVar15,local_108,uVar17);
      switch(s_00[-1] & 7) {
      case 0:
        s_00[-1] = s_00[-1] + cVar10 & 0xf8;
        break;
      case 1:
        s_00[-3] = (char)lVar14 + s_00[-3];
        break;
      case 2:
        *(short *)(s_00 + -5) = (short)lVar14 + *(short *)(s_00 + -5);
        break;
      case 3:
        *(int *)(s_00 + -9) = *(int *)(s_00 + -9) + (int)lVar14;
        break;
      case 4:
        goto switchD_0010844b_caseD_4;
      }
      goto switchD_0010844b_default;
    }
    if (bVar2 == 0) goto switchD_0010805b_default;
    if (bVar2 != 0x49) {
      if (bVar2 != 0x53) goto LAB_00108034;
LAB_00108073:
      uVar5 = (ulong)uVar8;
      if (uVar5 < 0x29) {
        uVar8 = uVar8 + 8;
        ppvVar7 = (void **)((long)local_e8 + uVar5);
      }
      else {
        ppvVar7 = local_120;
        local_120 = local_120 + 1;
      }
      __s = (char *)*ppvVar7;
      if (bVar2 == 0x73) {
        uVar5 = strlen(__s);
      }
      else {
        switch(__s[-1] & 7) {
        case 0:
          uVar5 = (ulong)((byte)__s[-1] >> 3);
          break;
        case 1:
          uVar5 = (ulong)(byte)__s[-3];
          break;
        case 2:
          uVar5 = (ulong)*(ushort *)(__s + -5);
          break;
        case 3:
          uVar5 = (ulong)*(uint *)(__s + -9);
          break;
        case 4:
          uVar5 = *(ulong *)(__s + -0x11);
          break;
        default:
          uVar5 = 0;
        }
      }
      switch(s_00[-1] & 7) {
      case 1:
        uVar17 = (ulong)(byte)s_00[-2];
        uVar9 = (ulong)(byte)s_00[-3];
        goto switchD_001073e4_caseD_5d;
      case 2:
        uVar17 = (ulong)*(ushort *)(s_00 + -3);
        uVar9 = (ulong)*(ushort *)(s_00 + -5);
switchD_001073e4_caseD_5d:
        uVar17 = uVar17 - uVar9;
        break;
      case 3:
        uVar17 = (ulong)(uint)(*(int *)(s_00 + -5) - *(int *)(s_00 + -9));
        break;
      case 4:
        uVar17 = *(long *)(s_00 + -9) - *(long *)(s_00 + -0x11);
        break;
      default:
        uVar17 = 0;
      }
      if (uVar17 < uVar5) {
        s_00 = sdsMakeRoomFor(s_00,uVar5);
      }
      memcpy(s_00 + uVar15,__s,uVar5);
      switch(s_00[-1] & 7) {
      case 0:
        s_00[-1] = (char)uVar5 * '\b' + s_00[-1] & 0xf8;
        break;
      case 1:
        s_00[-3] = s_00[-3] + (char)uVar5;
        break;
      case 2:
        *(short *)(s_00 + -5) = *(short *)(s_00 + -5) + (short)uVar5;
        break;
      case 3:
        *(int *)(s_00 + -9) = *(int *)(s_00 + -9) + (int)uVar5;
        break;
      case 4:
        *(ulong *)(s_00 + -0x11) = *(long *)(s_00 + -0x11) + uVar5;
      }
      uVar15 = uVar15 + uVar5;
      fmt = pcVar1;
      goto switchD_0010805b_default;
    }
    uVar5 = (ulong)uVar8;
    if (uVar5 < 0x29) {
      uVar8 = uVar8 + 8;
      ppvVar7 = (void **)((long)local_e8 + uVar5);
    }
    else {
      ppvVar7 = local_120;
      local_120 = local_120 + 1;
    }
    pvVar12 = *ppvVar7;
LAB_00108272:
    iVar3 = sdsll2str((char *)local_108,(longlong)pvVar12);
    switch(s_00[-1] & 7) {
    case 1:
      uVar5 = (ulong)(byte)s_00[-2];
      uVar17 = (ulong)(byte)s_00[-3];
      goto LAB_0010830e;
    case 2:
      uVar5 = (ulong)*(ushort *)(s_00 + -3);
      uVar17 = (ulong)*(ushort *)(s_00 + -5);
LAB_0010830e:
      uVar5 = uVar5 - uVar17;
      break;
    case 3:
      uVar5 = (ulong)(uint)(*(int *)(s_00 + -5) - *(int *)(s_00 + -9));
      break;
    case 4:
      uVar5 = *(long *)(s_00 + -9) - *(long *)(s_00 + -0x11);
      break;
    default:
      uVar5 = 0;
    }
    uVar17 = (ulong)iVar3;
    if (uVar5 < uVar17) {
      s_00 = sdsMakeRoomFor(s_00,uVar17);
    }
    memcpy(s_00 + uVar15,local_108,uVar17);
    switch(s_00[-1] & 7) {
    case 0:
      s_00[-1] = (char)iVar3 * '\b' + s_00[-1] & 0xf8;
      break;
    case 1:
      s_00[-3] = s_00[-3] + (char)iVar3;
      break;
    case 2:
      *(short *)(s_00 + -5) = *(short *)(s_00 + -5) + (short)iVar3;
      break;
    case 3:
      *(int *)(s_00 + -9) = *(int *)(s_00 + -9) + iVar3;
      break;
    case 4:
switchD_0010844b_caseD_4:
      *(ulong *)(s_00 + -0x11) = *(long *)(s_00 + -0x11) + uVar17;
    }
switchD_0010844b_default:
    uVar15 = uVar15 + uVar17;
    fmt = pcVar1;
switchD_0010805b_default:
    cVar10 = fmt[1];
    fmt = fmt + 1;
  } while( true );
}

Assistant:

sds sdscatfmt(sds s, char const *fmt, ...) {
    size_t initlen = sdslen(s);
    const char *f = fmt;
    long i;
    va_list ap;

    /* To avoid continuous reallocations, let's start with a buffer that
     * can hold at least two times the format string itself. It's not the
     * best heuristic but seems to work in practice. */
    s = sdsMakeRoomFor(s, initlen + strlen(fmt)*2);
    va_start(ap,fmt);
    f = fmt;    /* Next format specifier byte to process. */
    i = initlen; /* Position of the next byte to write to dest str. */
    while(*f) {
        char next, *str;
        size_t l;
        long long num;
        unsigned long long unum;

        /* Make sure there is always space for at least 1 char. */
        if (sdsavail(s)==0) {
            s = sdsMakeRoomFor(s,1);
        }

        switch(*f) {
        case '%':
            next = *(f+1);
            if (next == '\0') break;
            f++;
            switch(next) {
            case 's':
            case 'S':
                str = va_arg(ap,char*);
                l = (next == 's') ? strlen(str) : sdslen(str);
                if (sdsavail(s) < l) {
                    s = sdsMakeRoomFor(s,l);
                }
                memcpy(s+i,str,l);
                sdsinclen(s,l);
                i += l;
                break;
            case 'i':
            case 'I':
                if (next == 'i')
                    num = va_arg(ap,int);
                else
                    num = va_arg(ap,long long);
                {
                    char buf[SDS_LLSTR_SIZE];
                    l = sdsll2str(buf,num);
                    if (sdsavail(s) < l) {
                        s = sdsMakeRoomFor(s,l);
                    }
                    memcpy(s+i,buf,l);
                    sdsinclen(s,l);
                    i += l;
                }
                break;
            case 'u':
            case 'U':
                if (next == 'u')
                    unum = va_arg(ap,unsigned int);
                else
                    unum = va_arg(ap,unsigned long long);
                {
                    char buf[SDS_LLSTR_SIZE];
                    l = sdsull2str(buf,unum);
                    if (sdsavail(s) < l) {
                        s = sdsMakeRoomFor(s,l);
                    }
                    memcpy(s+i,buf,l);
                    sdsinclen(s,l);
                    i += l;
                }
                break;
            default: /* Handle %% and generally %<unknown>. */
                s[i++] = next;
                sdsinclen(s,1);
                break;
            }
            break;
        default:
            s[i++] = *f;
            sdsinclen(s,1);
            break;
        }
        f++;
    }
    va_end(ap);

    /* Add null-term */
    s[i] = '\0';
    return s;
}